

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::disconnectBroker(CoreBroker *this,BasicBrokerInfo *brk)

{
  bool bVar1;
  BrokerState BVar2;
  const_iterator cVar3;
  const_iterator this_00;
  long in_RSI;
  ActionMessage *in_RDI;
  BasicBrokerInfo *subbrk;
  const_iterator __end4;
  const_iterator __begin4;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *__range4;
  ActionMessage dis;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_fffffffffffffea8;
  ActionMessage *in_stack_fffffffffffffeb0;
  UnknownHandleManager *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  GlobalFederateId gid;
  undefined8 in_stack_fffffffffffffec8;
  action_t startingAction;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  GlobalFederateId local_118;
  BaseType local_114;
  reference local_110;
  CoreBroker *in_stack_fffffffffffffef8;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  in_stack_ffffffffffffff00;
  GlobalFederateId local_e8 [4];
  BaseType local_d8;
  GlobalFederateId local_d4 [3];
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  GlobalBrokerId in_stack_ffffffffffffff44;
  
  gid.gid = (BaseType)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  startingAction = (action_t)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  markAsDisconnected(in_stack_fffffffffffffef8,
                     (GlobalBrokerId)(BaseType)((ulong)in_stack_ffffffffffffff00._M_current >> 0x20)
                    );
  checkInFlightQueries
            ((CoreBroker *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff44);
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x5277a3);
  if ((BVar2 < OPERATING) && ((in_RDI[3].payload.buffer._M_elems[0x34] & 1) != 0)) {
    ActionMessage::ActionMessage((ActionMessage *)(local_d4 + 1),startingAction);
    local_d8 = *(BaseType *)(in_RSI + 0x20);
    GlobalFederateId::GlobalFederateId(local_d4,(GlobalBrokerId)local_d8);
    broadcast((CoreBroker *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_RDI);
    GlobalFederateId::GlobalFederateId(local_e8,(GlobalBrokerId)*(BaseType *)(in_RSI + 0x20));
    UnknownHandleManager::clearFederateUnknowns(in_stack_fffffffffffffeb8,gid);
    if ((*(byte *)(in_RSI + 0x2e) & 1) == 0) {
      cVar3 = gmlc::containers::
              DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              ::begin(in_stack_fffffffffffffea8);
      this_00 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::end(in_stack_fffffffffffffea8);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                               ((__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                 *)in_stack_fffffffffffffeb0,
                                (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                 *)in_stack_fffffffffffffea8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_110 = __gnu_cxx::
                    __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                    ::operator*((__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                 *)&stack0xffffffffffffff00);
        local_114 = *(BaseType *)(in_RSI + 0x20);
        bVar1 = GlobalBrokerId::operator==(&local_110->parent,(GlobalBrokerId)local_114);
        if ((bVar1) && ((local_110->_core & 1U) != 0)) {
          in_stack_fffffffffffffeb0 = (ActionMessage *)(in_RDI[8].payload.buffer._M_elems + 0x10);
          GlobalFederateId::GlobalFederateId(&local_118,(GlobalBrokerId)(local_110->global_id).gid);
          UnknownHandleManager::clearFederateUnknowns
                    ((UnknownHandleManager *)this_00._M_current,
                     (GlobalFederateId)(BaseType)((ulong)cVar3._M_current >> 0x20));
        }
        __gnu_cxx::
        __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
        ::operator++((__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                      *)&stack0xffffffffffffff00);
      }
    }
    ActionMessage::~ActionMessage(in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void CoreBroker::disconnectBroker(BasicBrokerInfo& brk)
{
    markAsDisconnected(brk.global_id);
    checkInFlightQueries(brk.global_id);
    if (getBrokerState() < BrokerState::OPERATING) {
        if (isRootc) {
            ActionMessage dis(CMD_BROADCAST_DISCONNECT);
            dis.source_id = brk.global_id;
            broadcast(dis);
            unknownHandles.clearFederateUnknowns(brk.global_id);
            if (!brk._core) {
                for (const auto& subbrk : mBrokers) {
                    if ((subbrk.parent == brk.global_id) && (subbrk._core)) {
                        unknownHandles.clearFederateUnknowns(subbrk.global_id);
                    }
                }
            }
        }
    }
}